

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
* __thiscall
pbrt::ParsedScene::CreateMedia_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
           *__return_storage_ptr__,ParsedScene *this,Allocator alloc)

{
  mapped_type *pmVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  MediumHandle medium;
  string type;
  string local_98;
  string local_78;
  Allocator local_58;
  string local_50;
  
  p_Var3 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (this->media)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->media)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    local_58.memoryResource = alloc.memoryResource;
    do {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"type","");
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
      ParameterDictionary::GetOneString
                (&local_50,(ParameterDictionary *)(p_Var2 + 3),&local_98,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_50._M_string_length == 0) {
        ErrorExit((FileLoc *)&p_Var2[6]._M_parent,"No parameter string \"type\" found for medium.");
      }
      if (*(char *)&p_Var2[0xf]._M_parent == '\x01') {
        Warning((FileLoc *)&p_Var2[6]._M_parent,
                "Animated transformation provided for medium. Only the start transform will be used."
               );
      }
      MediumHandle::Create
                ((MediumHandle *)&local_98,&local_50,(ParameterDictionary *)(p_Var2 + 3),
                 (Transform *)(p_Var2 + 7),(FileLoc *)&p_Var2[6]._M_parent,local_58);
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var2 + 1));
      (pmVar1->
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      ).bits = (uintptr_t)local_98._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, MediumHandle> ParsedScene::CreateMedia(Allocator alloc) const {
    std::map<std::string, MediumHandle> mediaMap;

    for (const auto &m : media) {
        std::string type = m.second.parameters.GetOneString("type", "");
        if (type.empty())
            ErrorExit(&m.second.loc, "No parameter string \"type\" found for medium.");

        if (m.second.renderFromObject.IsAnimated())
            Warning(&m.second.loc,
                    "Animated transformation provided for medium. Only the "
                    "start transform will be used.");
        MediumHandle medium = MediumHandle::Create(
            type, m.second.parameters, m.second.renderFromObject.startTransform,
            &m.second.loc, alloc);
        mediaMap[m.first] = medium;
    }

    return mediaMap;
}